

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

void proxy_close(proxy_handle *ph)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  plVar1 = (long *)ph->priv;
  iVar3 = registration_service_stop((registration_service_handle *)(plVar1 + 0x111));
  if (iVar3 < 0) {
    pcVar4 = strerror(-iVar3);
    proxy_log(ph,LOG_LEVEL_ERROR,"Failed to stop registration service (%d): %s\n",
              (ulong)(uint)-iVar3,pcVar4);
  }
  proxy_shutdown(ph);
  proxy_drop(ph);
  proxy_log(ph,LOG_LEVEL_DEBUG,"Closing client connections...\n");
  plVar1[0x104] = 0;
  if (0 < (int)plVar1[0x107]) {
    lVar5 = 0x18;
    lVar6 = 0;
    do {
      lVar2 = plVar1[0x103];
      worker_free((worker_handle *)(lVar2 + lVar5 + 8));
      mutex_free((mutex_handle *)(lVar2 + lVar5));
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x50;
    } while (lVar6 < (int)plVar1[0x107]);
  }
  memset(plVar1 + 1,0,0x810);
  if (0 < (int)plVar1[0x107]) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      proxy_conn_free((proxy_conn_handle *)(*plVar1 + lVar6));
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x48;
    } while (lVar5 < (int)plVar1[0x107]);
  }
  free((void *)plVar1[0x103]);
  plVar1[0x103] = 0;
  free((void *)*plVar1);
  *plVar1 = 0;
  *(undefined4 *)(plVar1 + 0x107) = 0;
  proxy_log(ph,LOG_LEVEL_DEBUG,"Closing listening connection...\n");
  conn_close((conn_handle *)(plVar1 + 0x108));
  proxy_log(ph,LOG_LEVEL_DEBUG,"Proxy is down - closing log.\n");
  log_close((log_handle *)(plVar1 + 0x10c));
  return;
}

Assistant:

void proxy_close(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	int i;
	int ret;

	ret = registration_service_stop(&priv->reg_service);
	if (ret < 0)
		proxy_log(ph, LOG_LEVEL_ERROR,
			  "Failed to stop registration service (%d): %s\n",
			  -ret, strerror(-ret));

	proxy_shutdown(ph);
	proxy_drop(ph);

	proxy_log(ph, LOG_LEVEL_DEBUG, "Closing client connections...\n");

	priv->idle_workers_head = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_worker_free(&priv->client_workers[i]);

	memset(priv->clients_by_call, 0x0, sizeof(priv->clients_by_call));
	priv->idle_clients_head = NULL;
	priv->idle_clients_tail_ptr = NULL;
	for (i = 0; i < priv->num_clients; i++)
		proxy_conn_free(&priv->clients[i]);

	free(priv->client_workers);
	priv->client_workers = NULL;
	free(priv->clients);
	priv->clients = NULL;
	priv->num_clients = 0;

	proxy_log(ph, LOG_LEVEL_DEBUG, "Closing listening connection...\n");

	conn_close(&priv->conn_listen);

	proxy_log(ph, LOG_LEVEL_DEBUG, "Proxy is down - closing log.\n");

	log_close(&priv->log);
}